

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O2

bool __thiscall
wasm::EquivalentClass::deriveParams
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          bool isCallIndirectionEnabled)

{
  Function *pFVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  pointer pPVar6;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *this_00;
  pointer this_01;
  pointer pDVar7;
  bool bVar8;
  pointer ppFVar9;
  ulong uVar10;
  ulong uVar11;
  pointer __result;
  pointer pDVar12;
  long lVar13;
  Expression **ppEVar14;
  Expression **ppEVar15;
  undefined7 in_register_00000009;
  _Tp_alloc_type *__alloc;
  ulong uVar16;
  Literal *other;
  bool bVar17;
  pointer *this_02;
  pointer ppFVar18;
  undefined1 auVar19 [8];
  pointer __lhs;
  initializer_list<wasm::Expression_**> __l;
  _Variadic_union<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_240;
  _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
  local_1e8;
  undefined1 local_1a8 [8];
  DeepValueIterator primaryIt;
  ConstDiff diff;
  Literals values;
  Expression **local_a8;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *local_a0;
  pointer local_98;
  char *local_90;
  undefined1 auStack_88 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  undefined1 auStack_68 [8];
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> siblingIterators;
  allocator_type local_35;
  uint local_34;
  
  local_90 = (this->primaryFunction->super_Importable).module.super_IString.str._M_str;
  if (local_90 == (char *)0x0) {
    uVar11 = CONCAT71(in_register_00000009,isCallIndirectionEnabled) & 0xffffffff;
    local_a0 = params;
    deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::
    DeepValueIterator::DeepValueIterator(wasm::Expression___(local_1a8,&this->primaryFunction->body)
    ;
    auStack_68 = (undefined1  [8])0x0;
    siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppFVar18 = (this->functions).
               super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppFVar9 = (this->functions).
              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppFVar9 - (long)ppFVar18) < 9) {
      __assert_fail("functions.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                    ,0x178,
                    "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                   );
    }
    local_34 = (uint)CONCAT71(in_register_00000009,isCallIndirectionEnabled);
    while (pDVar7 = siblingIterators.
                    super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                    _M_impl.super__Vector_impl_data._M_start, ppFVar18 = ppFVar18 + 1,
          ppFVar18 != ppFVar9) {
      pFVar1 = *ppFVar18;
      if (siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if ((long)siblingIterators.
                  super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)auStack_68 == 0x7fffffffffffffc0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = ((long)siblingIterators.
                        super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)auStack_68) / 0x70;
        uVar11 = uVar10;
        if ((undefined1  [8])
            siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_start == auStack_68) {
          uVar11 = 1;
        }
        uVar16 = uVar11 + uVar10;
        __alloc = (_Tp_alloc_type *)0x124924924924924;
        if (0x124924924924923 < uVar16) {
          uVar16 = 0x124924924924924;
        }
        if (CARRY8(uVar11,uVar10)) {
          uVar16 = 0x124924924924924;
        }
        local_98 = (pointer)auStack_68;
        if (uVar16 == 0) {
          __result = (pointer)0x0;
        }
        else {
          __result = (pointer)operator_new(uVar16 * 0x70);
        }
        deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
        ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
                  (__result + uVar10,&pFVar1->body);
        this_01 = local_98;
        pDVar12 = std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::_S_relocate
                            (local_98,pDVar7,__result,__alloc);
        pDVar12 = std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::_S_relocate
                            (pDVar7,pDVar7,pDVar12 + 1,__alloc);
        lVar13 = (long)siblingIterators.
                       super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)this_01;
        std::_Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>::_M_deallocate
                  ((_Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)this_01,
                   (pointer)(lVar13 / 0x70),lVar13 % 0x70);
        siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
        _M_impl.super__Vector_impl_data._M_finish = __result + uVar16;
        auStack_68 = (undefined1  [8])__result;
      }
      else {
        deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
        ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
                  (siblingIterators.
                   super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl
                   .super__Vector_impl_data._M_start,&pFVar1->body);
        pDVar12 = pDVar7 + 1;
      }
      uVar11 = (ulong)local_34;
      siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
      _M_impl.super__Vector_impl_data._M_start = pDVar12;
      ppFVar9 = (this->functions).
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    uVar11 = uVar11 ^ 1;
    local_34 = (uint)uVar11;
    while (((long)primaryIt.tasks.flexible.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)primaryIt.tasks.fixed._M_elems[9]
           >> 3) + (long)local_1a8 != 0) {
      ppEVar14 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)local_1a8);
      pDVar7 = siblingIterators.
               super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
               super__Vector_impl_data._M_start;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._M_first.
      _M_storage._M_storage[0x28] = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._41_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._24_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._M_first.
      _M_storage._M_storage[0x20] = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._33_7_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._8_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._16_8_ = 0;
      primaryIt.tasks.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._0_8_ = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_index = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._57_7_ = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pEVar2 = *ppEVar14;
      if (pEVar2->_id == ConstId) {
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)
                   ((long)&diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                   0x38),(Literal *)(pEVar2 + 1));
        pDVar7 = siblingIterators.
                 super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar17 = true;
        for (auVar19 = auStack_68; auVar19 != (undefined1  [8])pDVar7;
            auVar19 = (undefined1  [8])((long)auVar19 + 0x70)) {
          ppEVar15 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)auVar19);
          deriveParams::DeepValueIterator::operator++((DeepValueIterator *)auVar19);
          if ((*ppEVar15)->_id != ConstId) {
            handle_unreachable("all sibling functions should have the same instruction type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                               ,0x18e);
          }
          other = (Literal *)(*ppEVar15 + 1);
          bVar8 = Literal::operator==((Literal *)(pEVar2 + 1),other);
          SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)
                     ((long)&diff.
                             super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>
                     + 0x38),other);
          bVar17 = bVar8 && bVar17;
        }
        std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                  ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                   &primaryIt.tasks.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Literals *)
                   ((long)&diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                   0x38));
LAB_008c0106:
        this_00 = local_a0;
        this_02 = &values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        uVar11 = (ulong)local_34;
        if (!bVar17) {
          pPVar6 = (local_a0->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (__lhs = (local_a0->
                       super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                       _M_impl.super__Vector_impl_data._M_start; __lhs != pPVar6; __lhs = __lhs + 1)
          {
            bVar17 = std::operator==(&__lhs->values,
                                     (variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                      *)&primaryIt.tasks.flexible.
                                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar17) {
              local_240._0_8_ = ppEVar14;
              std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
              emplace_back<wasm::Expression**>
                        ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)
                         &__lhs->uses,(Expression ***)&local_240);
              goto LAB_008c01d4;
            }
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             *)&local_1e8,
                            (_Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             *)&primaryIt.tasks.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __l._M_len = 1;
          __l._M_array = &local_a8;
          local_a8 = ppEVar14;
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector
                    ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)this_02,
                     __l,&local_35);
          ParamInfo::ParamInfo
                    ((ParamInfo *)&local_240._M_first,(ConstDiff *)&local_1e8,
                     (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)this_02);
          std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::
          emplace_back<wasm::ParamInfo>(this_00,(ParamInfo *)&local_240._M_first);
          ParamInfo::~ParamInfo((ParamInfo *)&local_240._M_first);
          std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
          ~_Vector_base((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        this_02);
          std::__detail::__variant::
          _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::~_Variant_storage(&local_1e8);
        }
      }
      else {
        auVar19 = auStack_68;
        if (pEVar2->_id == CallId && (char)uVar11 == '\0') {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_88,
                     (value_type *)(pEVar2 + 3));
          pDVar7 = siblingIterators.
                   super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl
                   .super__Vector_impl_data._M_start;
          bVar17 = true;
          for (auVar19 = auStack_68; auVar19 != (undefined1  [8])pDVar7;
              auVar19 = (undefined1  [8])((long)auVar19 + 0x70)) {
            ppEVar15 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)auVar19);
            deriveParams::DeepValueIterator::operator++((DeepValueIterator *)auVar19);
            pEVar3 = *ppEVar15;
            if (pEVar3->_id != CallId) {
              handle_unreachable("all sibling functions should have the same instruction type",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                                 ,0x19d);
            }
            uVar4 = pEVar2[3].type.id;
            uVar5 = pEVar3[3].type.id;
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_88,
                       (value_type *)(pEVar3 + 3));
            bVar17 = bVar17 && uVar4 == uVar5;
          }
          std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                    ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                     &primaryIt.tasks.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_88);
          goto LAB_008c0106;
        }
        for (; auVar19 != (undefined1  [8])pDVar7; auVar19 = (undefined1  [8])((long)auVar19 + 0x70)
            ) {
          ppEVar15 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)auVar19);
          if ((*ppEVar15)->_id != (*ppEVar14)->_id) {
            __assert_fail("(*it)->_id == primary->_id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                          ,0x1a6,
                          "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                         );
          }
          deriveParams::DeepValueIterator::operator++((DeepValueIterator *)auVar19);
        }
      }
LAB_008c01d4:
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_88);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)
                 ((long)&diff.
                         super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                         .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                         super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                         super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                         super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                         super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                 0x38));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
      ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           *)&primaryIt.tasks.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      deriveParams::DeepValueIterator::operator++((DeepValueIterator *)local_1a8);
    }
    std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::~vector
              ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)auStack_68);
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
               (primaryIt.tasks.fixed._M_elems + 9));
  }
  return local_90 == (char *)0x0;
}

Assistant:

bool EquivalentClass::deriveParams(Module* module,
                                   std::vector<ParamInfo>& params,
                                   bool isCallIndirectionEnabled) {
  // Allows iteration over children of the root expression recursively.
  struct DeepValueIterator {
    // The DFS work list.
    SmallVector<Expression**, 10> tasks;

    DeepValueIterator(Expression** root) { tasks.push_back(root); }

    void operator++() {
      ChildIterator it(*tasks.back());
      tasks.pop_back();
      for (Expression*& child : it) {
        tasks.push_back(&child);
      }
    }

    Expression*& operator*() {
      assert(!empty());
      return *tasks.back();
    }
    bool empty() { return tasks.empty(); }
  };

  if (primaryFunction->imported()) {
    return false;
  }
  DeepValueIterator primaryIt(&primaryFunction->body);
  std::vector<DeepValueIterator> siblingIterators;
  // Skip the first function, as it is the primary function to compare the
  // primary function with the other functions based on the primary instr type.
  assert(functions.size() >= 2);
  for (auto func = functions.begin() + 1; func != functions.end(); ++func) {
    siblingIterators.emplace_back(&(*func)->body);
  }

  for (; !primaryIt.empty(); ++primaryIt) {
    Expression*& primary = *primaryIt;
    ConstDiff diff;
    Literals values;
    std::vector<Name> names;

    bool isAllSame = true;
    if (auto* primaryConst = primary->dynCast<Const>()) {
      values.push_back(primaryConst->value);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingConst = sibling->dynCast<Const>()) {
          isAllSame &= primaryConst->value == siblingConst->value;
          values.push_back(siblingConst->value);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = values;
    } else if (isCallIndirectionEnabled && primary->is<Call>()) {
      auto* primaryCall = primary->dynCast<Call>();
      names.push_back(primaryCall->target);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingCall = sibling->dynCast<Call>()) {
          isAllSame &= primaryCall->target == siblingCall->target;
          names.push_back(siblingCall->target);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = names;
    } else {
      // Skip non-constant expressions, which are ensured to be the exactly
      // same.
      for (auto& it : siblingIterators) {
        // Sibling functions in a class should have the same instruction type.
        assert((*it)->_id == primary->_id);
        ++it;
      }
      continue;
    }
    // If all values are the same, skip to parameterize it.
    if (isAllSame) {
      continue;
    }
    // If the derived param is already in the params, reuse it.
    // e.g.
    //
    // ```
    // (func $use-42-twice (result i32)
    //   (i32.add (i32.const 42) (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //   (i32.add (i32.const 43) (i32.const 43))
    // )
    // ```
    //
    // will be merged reusing the parameter [42, 43]
    //
    // ```
    // (func $use-42-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 43))
    // )
    // (func $byn$mgfn-shared$use-42-twice (param $0 i32) (result i32)
    //  (i32.add (local.get $0) (local.get $0))
    // )
    // ```
    //
    bool paramReused = false;
    for (auto& param : params) {
      if (param.values == diff) {
        param.uses.push_back(&primary);
        paramReused = true;
        break;
      }
    }
    if (!paramReused) {
      params.push_back(ParamInfo(diff, {&primary}));
    }
  }
  return true;
}